

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

void extractPackageName(char *filename,char *pkg,int32_t capacity)

{
  int iVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  FILE *__stream;
  long lVar4;
  uint8_t *data;
  undefined8 extraout_RAX;
  char *in_RCX;
  uint *extraout_RDX;
  char *name;
  uint uVar5;
  ulong __n;
  UErrorCode UStack_464;
  char acStack_460 [1032];
  char *pcStack_58;
  size_t sStack_50;
  
  name = pkg;
  __s = findBasename(filename);
  sVar3 = strlen(__s);
  uVar2 = (uint)sVar3;
  if ((int)uVar2 < 5) {
LAB_001e75c9:
    extractPackageName();
  }
  else {
    __n = (ulong)(uVar2 - 4);
    name = ".dat";
    iVar1 = strcmp(__s + __n,".dat");
    if (iVar1 != 0) goto LAB_001e75c9;
    if (uVar2 < 0x44) {
      memcpy(pkg,__s,__n);
      pkg[__n] = '\0';
      return;
    }
  }
  extractPackageName();
  pcStack_58 = pkg;
  sStack_50 = sVar3;
  makeFullFilename(__s,name,acStack_460,(int32_t)in_RCX);
  __stream = fopen(acStack_460,"rb");
  if (__stream == (FILE *)0x0) {
    readFile();
LAB_001e7712:
    readFile();
LAB_001e771f:
    readFile();
  }
  else {
    fseek(__stream,0,2);
    lVar4 = ftell(__stream);
    fseek(__stream,0,0);
    iVar1 = ferror(__stream);
    uVar2 = (uint)lVar4;
    if (((int)uVar2 < 1) || (iVar1 != 0)) goto LAB_001e7712;
    uVar5 = uVar2 + 0xf & 0x7ffffff0;
    *extraout_RDX = uVar5;
    data = (uint8_t *)uprv_malloc_63((ulong)uVar5);
    if (data == (uint8_t *)0x0) goto LAB_001e771f;
    sVar3 = fread(data,1,(ulong)(uVar2 & 0x7fffffff),__stream);
    if (uVar2 == (uint)sVar3) {
      iVar1 = *extraout_RDX - uVar2;
      if (iVar1 != 0 && (int)uVar2 <= (int)*extraout_RDX) {
        memset(data + (uVar2 & 0x7fffffff),0xaa,(long)iVar1);
      }
      fclose(__stream);
      UStack_464 = U_ZERO_ERROR;
      uVar2 = getTypeEnumForInputData(data,*extraout_RDX,&UStack_464);
      if ((-1 < (int)uVar2) && (UStack_464 < U_ILLEGAL_ARGUMENT_ERROR)) {
        *in_RCX = "lb?e"[uVar2];
        uprv_free_63((void *)0x0);
        return;
      }
      goto LAB_001e7737;
    }
  }
  readFile();
LAB_001e7737:
  readFile();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

static void
extractPackageName(const char *filename,
                   char pkg[], int32_t capacity) {
    const char *basename;
    int32_t len;

    basename=findBasename(filename);
    len=(int32_t)strlen(basename)-4; /* -4: subtract the length of ".dat" */

    if(len<=0 || 0!=strcmp(basename+len, ".dat")) {
        fprintf(stderr, "icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
                         basename);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(len>=capacity) {
        fprintf(stderr, "icupkg: the package name \"%s\" is too long (>=%ld)\n",
                         basename, (long)capacity);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    memcpy(pkg, basename, len);
    pkg[len]=0;
}